

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O0

void __thiscall wasm::AlignmentLowering::visitLoad(AlignmentLowering *this,Load *curr)

{
  bool bVar1;
  UnaryOp op;
  address64_t aVar2;
  Module *pMVar3;
  Expression *pEVar4;
  Memory *pMVar5;
  Function *func;
  LocalGet *pLVar6;
  Load *pLVar7;
  Unary *left;
  Const *right;
  Binary *right_00;
  optional<wasm::Type> type_00;
  optional<wasm::Type> local_f8;
  Binary *local_e8;
  Binary *combined;
  char *local_d8;
  Type local_d0;
  uintptr_t local_c8;
  Address local_c0;
  Binary *local_b8;
  Expression *high;
  char *local_a8;
  Type local_a0;
  uintptr_t local_98;
  Address local_90;
  Unary *local_88;
  Expression *low;
  LocalSet *set;
  Index local_6c;
  Type TStack_68;
  Index temp;
  Type addressType;
  Memory *mem;
  Type local_40;
  Block *local_38;
  Expression *replacement;
  BasicType type;
  Builder builder;
  Load *curr_local;
  AlignmentLowering *this_local;
  
  builder.wasm._4_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                      type,(BasicType *)((long)&builder.wasm + 4));
  if (bVar1) {
    Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                ).
                super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                .
                super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
               ,curr->ptr);
  }
  else {
    aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
    if ((aVar2 != 0) &&
       (aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align), aVar2 != curr->bytes))
    {
      pMVar3 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
               getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        );
      Builder::Builder((Builder *)&stack0xffffffffffffffd8,pMVar3);
      replacement._4_4_ =
           wasm::Type::getBasic
                     (&(curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                       type);
      switch(replacement._4_4_) {
      case i32:
        local_38 = (Block *)lowerLoadI32(this,curr);
        break;
      case i64:
      case f64:
        if ((replacement._4_4_ == i64) && (curr->bytes != '\b')) {
          wasm::Type::Type((Type *)&mem,i32);
          (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id =
               (uintptr_t)mem;
          op = ExtendUInt32;
          if ((curr->signed_ & 1U) != 0) {
            op = ExtendSInt32;
          }
          pEVar4 = lowerLoadI32(this,curr);
          local_38 = (Block *)Builder::makeUnary((Builder *)&stack0xffffffffffffffd8,op,pEVar4);
        }
        else {
          pMVar3 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
                   getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                              ).
                              super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                              .
                              super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            );
          addressType.id = (curr->memory).super_IString.str._M_len;
          pMVar5 = Module::getMemory(pMVar3,(Name)(curr->memory).super_IString.str);
          TStack_68.id = (pMVar5->addressType).id;
          func = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
                 getFunction(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                              ).
                              super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                              .
                              super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            );
          set = (LocalSet *)TStack_68.id;
          local_6c = Builder::addVar(func,TStack_68);
          low = (Expression *)
                Builder::makeLocalSet((Builder *)&stack0xffffffffffffffd8,local_6c,curr->ptr);
          local_90.addr = (curr->offset).addr;
          aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
          local_98 = TStack_68.id;
          pLVar6 = Builder::makeLocalGet((Builder *)&stack0xffffffffffffffd8,local_6c,TStack_68);
          wasm::Type::Type(&local_a0,i32);
          high = (Expression *)(curr->memory).super_IString.str._M_len;
          local_a8 = (curr->memory).super_IString.str._M_str;
          pLVar7 = Builder::makeLoad((Builder *)&stack0xffffffffffffffd8,4,false,local_90,
                                     (uint)aVar2,(Expression *)pLVar6,local_a0,
                                     (Name)(curr->memory).super_IString.str);
          local_88 = (Unary *)lowerLoadI32(this,pLVar7);
          local_88 = Builder::makeUnary((Builder *)&stack0xffffffffffffffd8,ExtendUInt32,
                                        (Expression *)local_88);
          aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
          wasm::Address::Address(&local_c0,aVar2 + 4);
          aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
          local_c8 = TStack_68.id;
          pLVar6 = Builder::makeLocalGet((Builder *)&stack0xffffffffffffffd8,local_6c,TStack_68);
          wasm::Type::Type(&local_d0,i32);
          combined = (Binary *)(curr->memory).super_IString.str._M_len;
          local_d8 = (curr->memory).super_IString.str._M_str;
          pLVar7 = Builder::makeLoad((Builder *)&stack0xffffffffffffffd8,4,false,local_c0,
                                     (uint)aVar2,(Expression *)pLVar6,local_d0,
                                     (Name)(curr->memory).super_IString.str);
          local_b8 = (Binary *)lowerLoadI32(this,pLVar7);
          left = Builder::makeUnary((Builder *)&stack0xffffffffffffffd8,ExtendUInt32,
                                    (Expression *)local_b8);
          local_b8 = (Binary *)left;
          right = Builder::makeConst<long>((Builder *)&stack0xffffffffffffffd8,0x20);
          local_b8 = Builder::makeBinary((Builder *)&stack0xffffffffffffffd8,ShlInt64,
                                         (Expression *)left,(Expression *)right);
          right_00 = Builder::makeBinary((Builder *)&stack0xffffffffffffffd8,OrInt64,
                                         (Expression *)local_88,(Expression *)local_b8);
          pEVar4 = low;
          local_e8 = right_00;
          std::optional<wasm::Type>::optional(&local_f8);
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_f8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_f8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          local_38 = Builder::makeSequence
                               ((Builder *)&stack0xffffffffffffffd8,pEVar4,(Expression *)right_00,
                                type_00);
          if (replacement._4_4_ == f64) {
            local_38 = (Block *)Builder::makeUnary((Builder *)&stack0xffffffffffffffd8,
                                                   ReinterpretInt64,(Expression *)local_38);
          }
        }
        break;
      case f32:
        wasm::Type::Type(&local_40,i32);
        (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id =
             local_40.id;
        pEVar4 = lowerLoadI32(this,curr);
        local_38 = (Block *)Builder::makeUnary((Builder *)&stack0xffffffffffffffd8,ReinterpretInt32,
                                               pEVar4);
        break;
      default:
        handle_unreachable("unhandled unaligned load",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0x103);
      }
      Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                  .
                  super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                 ,(Expression *)local_38);
    }
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
    // If unreachable, just remove the load, which removes the unaligned
    // operation in a trivial way.
    if (curr->type == Type::unreachable) {
      replaceCurrent(curr->ptr);
      return;
    }
    if (curr->align == 0 || curr->align == curr->bytes) {
      // Nothing to do: leave the node unchanged. All code lower down assumes
      // the operation is unaligned.
      return;
    }
    Builder builder(*getModule());
    auto type = curr->type.getBasic();
    Expression* replacement;
    switch (type) {
      default:
        WASM_UNREACHABLE("unhandled unaligned load");
      case Type::i32:
        replacement = lowerLoadI32(curr);
        break;
      case Type::f32:
        curr->type = Type::i32;
        replacement = builder.makeUnary(ReinterpretInt32, lowerLoadI32(curr));
        break;
      case Type::i64:
      case Type::f64:
        if (type == Type::i64 && curr->bytes != 8) {
          // A load of <64 bits.
          curr->type = Type::i32;
          replacement = builder.makeUnary(
            curr->signed_ ? ExtendSInt32 : ExtendUInt32, lowerLoadI32(curr));
          break;
        }
        // Load two 32-bit pieces, and combine them.
        auto mem = getModule()->getMemory(curr->memory);
        auto addressType = mem->addressType;
        auto temp = builder.addVar(getFunction(), addressType);
        auto* set = builder.makeLocalSet(temp, curr->ptr);
        Expression* low =
          lowerLoadI32(builder.makeLoad(4,
                                        false,
                                        curr->offset,
                                        curr->align,
                                        builder.makeLocalGet(temp, addressType),
                                        Type::i32,
                                        curr->memory));
        low = builder.makeUnary(ExtendUInt32, low);
        // Note that the alignment is assumed to be the same here, even though
        // we add an offset of 4. That is because this is an unaligned load, so
        // the alignment is 1, 2, or 4, which means it stays the same after
        // adding 4.
        Expression* high =
          lowerLoadI32(builder.makeLoad(4,
                                        false,
                                        curr->offset + 4,
                                        curr->align,
                                        builder.makeLocalGet(temp, addressType),
                                        Type::i32,
                                        curr->memory));
        high = builder.makeUnary(ExtendUInt32, high);
        high =
          builder.makeBinary(ShlInt64, high, builder.makeConst(int64_t(32)));
        auto* combined = builder.makeBinary(OrInt64, low, high);
        replacement = builder.makeSequence(set, combined);
        // Ensure the proper output type.
        if (type == Type::f64) {
          replacement = builder.makeUnary(ReinterpretInt64, replacement);
        }
        break;
    }
    replaceCurrent(replacement);
  }